

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.h
# Opt level: O2

void duckdb_je_stats_interval_event_handler(tsd_t *tsd,uint64_t elapsed)

{
  atomic_u64_t aVar1;
  atomic_u64_t aVar2;
  bool bVar3;
  
  aVar2 = stats_interval_accumulated.accumbytes.val.repr;
  do {
    while (aVar1.repr = aVar2.repr + elapsed, stats_interval_accumulated.interval <= aVar1.repr) {
      LOCK();
      bVar3 = (atomic_u64_t)aVar2.repr == stats_interval_accumulated.accumbytes.val.repr;
      aVar1.repr = aVar1.repr % stats_interval_accumulated.interval;
      if (!bVar3) {
        aVar2 = stats_interval_accumulated.accumbytes.val.repr;
        aVar1 = stats_interval_accumulated.accumbytes.val.repr;
      }
      stats_interval_accumulated.accumbytes.val.repr = (atomic_u64_t)(atomic_u64_t)aVar1.repr;
      UNLOCK();
      if (bVar3) {
        duckdb_je_malloc_stats_print
                  ((write_cb_t *)0x0,(void *)0x0,duckdb_je_opt_stats_interval_opts);
        return;
      }
    }
    LOCK();
    bVar3 = (atomic_u64_t)aVar2.repr != stats_interval_accumulated.accumbytes.val.repr;
    if (bVar3) {
      aVar2 = stats_interval_accumulated.accumbytes.val.repr;
      aVar1 = stats_interval_accumulated.accumbytes.val.repr;
    }
    stats_interval_accumulated.accumbytes.val.repr = (atomic_u64_t)(atomic_u64_t)aVar1.repr;
    UNLOCK();
  } while (bVar3);
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE bool
counter_accum(tsdn_t *tsdn, counter_accum_t *counter, uint64_t bytes) {
	uint64_t interval = counter->interval;
	assert(interval > 0);
	LOCKEDINT_MTX_LOCK(tsdn, counter->mtx);
	/*
	 * If the event moves fast enough (and/or if the event handling is slow
	 * enough), extreme overflow can cause counter trigger coalescing.
	 * This is an intentional mechanism that avoids rate-limiting
	 * allocation.
	 */
	bool overflow = locked_inc_mod_u64(tsdn, LOCKEDINT_MTX(counter->mtx),
	    &counter->accumbytes, bytes, interval);
	LOCKEDINT_MTX_UNLOCK(tsdn, counter->mtx);
	return overflow;
}